

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quat4f.cpp
# Opt level: O3

Quat4f __thiscall Quat4f::slerp(Quat4f *this,Quat4f *a,Quat4f *b,float t,bool allowFlip)

{
  uint uVar1;
  float fVar2;
  float fVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  Quat4f QVar17;
  
  fVar3 = a->m_elements[0];
  fVar8 = a->m_elements[1];
  fVar9 = a->m_elements[2];
  fVar10 = a->m_elements[3];
  fVar11 = b->m_elements[0];
  fVar12 = b->m_elements[1];
  fVar13 = b->m_elements[2];
  fVar14 = b->m_elements[3];
  fVar16 = fVar14 * fVar10 + fVar13 * fVar9 + fVar3 * fVar11 + fVar8 * fVar12;
  dVar4 = (double)ABS(fVar16);
  if (0.009999999776482582 <= 1.0 - dVar4) {
    dVar4 = acos(dVar4);
    fVar3 = (float)dVar4;
    dVar4 = sin((double)fVar3);
    dVar5 = sin((double)((1.0 - t) * fVar3));
    dVar4 = (double)(float)dVar4;
    auVar6._0_8_ = sin((double)(fVar3 * t));
    auVar6._8_8_ = dVar5;
    auVar7._8_4_ = SUB84(dVar4,0);
    auVar7._0_8_ = dVar4;
    auVar7._12_4_ = (int)((ulong)dVar4 >> 0x20);
    auVar7 = divpd(auVar6,auVar7);
    t = (float)auVar7._0_8_;
    fVar2 = (float)auVar7._8_8_;
    fVar3 = a->m_elements[0];
    fVar8 = a->m_elements[1];
    fVar9 = a->m_elements[2];
    fVar10 = a->m_elements[3];
    fVar11 = b->m_elements[0];
    fVar12 = b->m_elements[1];
    fVar13 = b->m_elements[2];
    fVar14 = b->m_elements[3];
  }
  else {
    fVar2 = 1.0 - t;
  }
  QVar17.m_elements[1] = fVar2;
  QVar17.m_elements[0] = fVar2;
  fVar15 = fVar2;
  if (allowFlip) {
    fVar15 = -fVar2;
  }
  uVar1 = -(uint)(fVar16 < 0.0);
  fVar16 = (float)(~uVar1 & (uint)fVar2 | (uint)fVar15 & uVar1);
  this->m_elements[0] = fVar16 * fVar3 + t * fVar11;
  this->m_elements[1] = fVar16 * fVar8 + t * fVar12;
  this->m_elements[2] = fVar16 * fVar9 + t * fVar13;
  this->m_elements[3] = fVar16 * fVar10 + t * fVar14;
  QVar17.m_elements[3] = fVar8;
  QVar17.m_elements[2] = fVar3;
  return (Quat4f)QVar17.m_elements;
}

Assistant:

Quat4f Quat4f::slerp( const Quat4f& a, const Quat4f& b, float t, bool allowFlip )
{
	float cosAngle = Quat4f::dot( a, b );

	float c1;
	float c2;

	// Linear interpolation for close orientations
	if( ( 1.0f - fabs( cosAngle ) ) < 0.01f )
	{
		c1 = 1.0f - t;
		c2 = t;
	}
	else
	{
		// Spherical interpolation
		float angle = acos( fabs( cosAngle ) );
		float sinAngle = sin( angle );
		c1 = sin( angle * ( 1.0f - t ) ) / sinAngle;
		c2 = sin( angle * t ) / sinAngle;
	}

	// Use the shortest path
	if( allowFlip && ( cosAngle < 0.0f ) )
	{
		c1 = -c1;
	}

	return Quat4f( c1 * a[ 0 ] + c2 * b[ 0 ], c1 * a[ 1 ] + c2 * b[ 1 ], c1 * a[ 2 ] + c2 * b[ 2 ], c1 * a[ 3 ] + c2 * b[ 3 ] );
}